

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::AlignFirstTextHeightToWidgets(void)

{
  float fVar1;
  ImVec2 local_20;
  ImGuiContext *local_18;
  ImGuiContext *g;
  ImGuiWindow *window;
  
  g = (ImGuiContext *)GetCurrentWindow();
  if (((ulong)(g->IO).UserData & 0x100000000) == 0) {
    local_18 = GImGui;
    fVar1 = (GImGui->Style).FramePadding.y;
    ImVec2::ImVec2(&local_20,0.0,fVar1 + fVar1 + GImGui->FontSize);
    ItemSize(&local_20,(local_18->Style).FramePadding.y);
    SameLine(0.0,0.0);
  }
  return;
}

Assistant:

void ImGui::AlignFirstTextHeightToWidgets()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    // Declare a dummy item size to that upcoming items that are smaller will center-align on the newly expanded line height.
    ImGuiContext& g = *GImGui;
    ItemSize(ImVec2(0, g.FontSize + g.Style.FramePadding.y*2), g.Style.FramePadding.y);
    SameLine(0, 0);
}